

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

void swap_data(bam1_core_t *c,int l_data,uint8_t *data,int is_host)

{
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  ulong *puVar4;
  byte bVar5;
  ulong *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar9 = *(ulong *)&c->field_0x8 >> 0x18 & 0xff;
  uVar10 = *(ulong *)&c->field_0x8 >> 0x30;
  iVar3 = c->l_qseq;
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      uVar7 = *(uint *)(data + uVar11 * 4 + uVar9);
      *(uint *)(data + uVar11 * 4 + uVar9) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      uVar11 = uVar11 + 1;
    } while (uVar11 < *(ushort *)&c->field_0xe);
  }
  puVar6 = (ulong *)(data + (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) +
                            (long)iVar3 + uVar10 * 4 + uVar9);
  while( true ) {
    if (data + l_data <= puVar6) {
      return;
    }
    bVar2 = *(byte *)((long)puVar6 + 2);
    if (0x59 < bVar2) break;
    switch(bVar2) {
    case 0x41:
    case 0x43:
switchD_00138d71_caseD_41:
      puVar4 = (ulong *)((long)puVar6 + 4);
      break;
    case 0x42:
    case 0x48:
switchD_00138d71_caseD_42:
      puVar4 = (ulong *)((long)puVar6 + 3);
      if (bVar2 == 0x42) {
        bVar2 = *(byte *)puVar4;
        bVar5 = 1;
        if (bVar2 < 0x5a) {
          switch(bVar2) {
          case 0x41:
          case 0x43:
            break;
          case 0x42:
          case 0x48:
            bVar5 = bVar2;
            break;
          case 0x44:
          case 0x45:
          case 0x46:
          case 0x47:
switchD_00138e24_caseD_44:
            bVar5 = 0;
            break;
          case 0x49:
switchD_00138e24_caseD_49:
            bVar5 = 4;
            break;
          default:
            if (bVar2 != 0x53) goto switchD_00138e24_caseD_44;
LAB_00138e53:
            bVar5 = 2;
          }
        }
        else {
          switch(bVar2) {
          case 99:
            break;
          case 100:
            bVar5 = 8;
            break;
          case 0x65:
          case 0x67:
          case 0x68:
            goto switchD_00138e24_caseD_44;
          case 0x66:
          case 0x69:
            goto switchD_00138e24_caseD_49;
          default:
            bVar5 = bVar2;
            if (bVar2 != 0x5a) {
              if (bVar2 == 0x73) goto LAB_00138e53;
              goto switchD_00138e24_caseD_44;
            }
          }
        }
        if (is_host == 0) {
          uVar7 = *(uint *)((long)puVar6 + 4);
          uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar8 = uVar7;
        }
        else {
          uVar7 = *(uint *)((long)puVar6 + 4);
          uVar8 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        }
        *(uint *)((long)puVar6 + 4) = uVar8;
        puVar4 = puVar6 + 1;
        switch(bVar5) {
        case 1:
          puVar4 = (ulong *)((long)puVar4 + (ulong)uVar7);
          break;
        case 2:
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            *(ushort *)puVar4 = (ushort)*puVar4 << 8 | (ushort)*puVar4 >> 8;
            puVar4 = (ulong *)((long)puVar4 + 2);
          }
          break;
        case 4:
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            uVar8 = (uint)*puVar4;
            *(uint *)puVar4 =
                 uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            puVar4 = (ulong *)((long)puVar4 + 4);
          }
          break;
        case 8:
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            uVar9 = *puVar4;
            *puVar4 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            puVar4 = puVar4 + 1;
          }
        }
      }
      else {
        puVar6 = puVar4;
        if ((bVar2 == 0x5a) || (bVar2 == 0x48)) {
          do {
            puVar4 = (ulong *)((long)puVar6 + 1);
            uVar9 = *puVar6;
            puVar6 = puVar4;
          } while ((byte)uVar9 != 0);
        }
      }
      break;
    case 0x49:
switchD_00138d71_caseD_49:
      uVar7 = *(uint *)((long)puVar6 + 3);
      *(uint *)((long)puVar6 + 3) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      puVar4 = (ulong *)((long)puVar6 + 7);
      break;
    default:
      if (bVar2 == 0x53) {
LAB_00138da9:
        puVar1 = (ushort *)((long)puVar6 + 3);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        puVar4 = (ulong *)((long)puVar6 + 5);
        break;
      }
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
switchD_00138d71_caseD_44:
      puVar4 = (ulong *)((long)puVar6 + 3);
    }
switchD_00138e96_caseD_3:
    puVar6 = puVar4;
  }
  switch(bVar2) {
  case 99:
    goto switchD_00138d71_caseD_41;
  case 100:
    uVar9 = *(ulong *)((long)puVar6 + 3);
    *(ulong *)((long)puVar6 + 3) =
         uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    puVar4 = (ulong *)((long)puVar6 + 0xb);
    goto switchD_00138e96_caseD_3;
  case 0x65:
  case 0x67:
  case 0x68:
    break;
  case 0x66:
  case 0x69:
    goto switchD_00138d71_caseD_49;
  default:
    if (bVar2 == 0x5a) goto switchD_00138d71_caseD_42;
    if (bVar2 == 0x73) goto LAB_00138da9;
  }
  goto switchD_00138d71_caseD_44;
}

Assistant:

static void swap_data(const bam1_core_t *c, int l_data, uint8_t *data, int is_host)
{
    uint8_t *s;
    uint32_t *cigar = (uint32_t*)(data + c->l_qname);
    uint32_t i, n;
    s = data + c->n_cigar*4 + c->l_qname + c->l_qseq + (c->l_qseq + 1)/2;
    for (i = 0; i < c->n_cigar; ++i) ed_swap_4p(&cigar[i]);
    while (s < data + l_data) {
        int size;
        s += 2; // skip key
        size = aux_type2size(*s); ++s; // skip type
        switch (size) {
        case 1: ++s; break;
        case 2: ed_swap_2p(s); s += 2; break;
        case 4: ed_swap_4p(s); s += 4; break;
        case 8: ed_swap_8p(s); s += 8; break;
        case 'Z':
        case 'H':
            while (*s) ++s;
            ++s;
            break;
        case 'B':
            size = aux_type2size(*s); ++s;
            if (is_host) memcpy(&n, s, 4), ed_swap_4p(s);
            else ed_swap_4p(s), memcpy(&n, s, 4);
            s += 4;
            switch (size) {
            case 1: s += n; break;
            case 2: for (i = 0; i < n; ++i, s += 2) ed_swap_2p(s); break;
            case 4: for (i = 0; i < n; ++i, s += 4) ed_swap_4p(s); break;
            case 8: for (i = 0; i < n; ++i, s += 8) ed_swap_8p(s); break;
            }
            break;
        }
    }
}